

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginGlobal
          (BinaryReaderInterp *this,Index index,Type type,bool mutable_)

{
  Offset OVar1;
  ModuleDesc *pMVar2;
  char *pcVar3;
  Result RVar4;
  Enum EVar5;
  GlobalType global_type;
  Location loc;
  undefined1 local_180 [20];
  Mutability local_16c;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_168;
  undefined **local_150;
  ExternKind local_148;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_140;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_128;
  vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> local_110;
  u32 local_f8;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_f0;
  undefined1 local_d8 [24];
  undefined **local_c0;
  ExternKind local_b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_98;
  vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> local_80;
  u32 local_68;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_60;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  local_c0 = (undefined **)((ulong)local_c0 & 0xffffffff00000000);
  local_d8._0_8_ = (this->filename_)._M_len;
  pcVar3 = (this->filename_)._M_str;
  local_d8._8_4_ = SUB84(pcVar3,0);
  local_d8._12_4_ = (undefined4)((ulong)pcVar3 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_d8._16_4_ = (undefined4)OVar1;
  local_d8._20_4_ = (undefined4)(OVar1 >> 0x20);
  RVar4 = SharedValidator::OnGlobal(&this->validator_,(Location *)local_d8,type,mutable_);
  EVar5 = Error;
  if (RVar4.enum_ != Error) {
    local_16c = (Mutability)mutable_;
    local_180._8_4_ = Global;
    local_180._0_8_ = &PTR__ExternType_00184180;
    local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180._12_8_ = type;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    *local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
     super__Vector_impl_data._M_start = type;
    local_148 = First;
    local_150 = &PTR__FuncType_001840c0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_140,&local_168);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_128,&local_48);
    local_110.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_110.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_110.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8 = 0xffffffff;
    local_f0.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f0.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (Type *)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pMVar2 = this->module_;
    local_d8._8_4_ = Global;
    local_d8._0_8_ = &PTR__ExternType_00184180;
    local_d8._12_4_ = (undefined4)local_180._12_8_;
    local_d8._16_4_ = SUB84(local_180._12_8_,4);
    local_d8._20_4_ = local_16c;
    local_b8 = local_148;
    local_c0 = &PTR__FuncType_001840c0;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_b0,&local_140);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_98,&local_128);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              (&local_80,&local_110);
    local_68 = local_f8;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&local_60,&local_f0);
    std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::
    emplace_back<wabt::interp::GlobalDesc>(&pMVar2->globals,(GlobalDesc *)local_d8);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_60);
    if (local_80.
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_c0 = &PTR__FuncType_001840c0;
    if (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::push_back
              (&this->global_types_,(value_type *)local_180);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_f0);
    if (local_110.
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_110.
                      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_110.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_150 = &PTR__FuncType_001840c0;
    if (local_128.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_140.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_140.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderInterp::BeginGlobal(Index index, Type type, bool mutable_) {
  CHECK_RESULT(validator_.OnGlobal(GetLocation(), type, mutable_));
  GlobalType global_type{type, ToMutability(mutable_)};
  FuncDesc init_func{FuncType{{}, {type}}, {}, Istream::kInvalidOffset, {}};
  module_.globals.push_back(GlobalDesc{global_type, init_func});
  global_types_.push_back(global_type);
  return Result::Ok;
}